

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.h
# Opt level: O1

void __thiscall hwnet::util::TimerMgr::pop(TimerMgr *this)

{
  size_t sVar1;
  pointer ppTVar2;
  Timer *pTVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  value_type e;
  
  sVar1 = this->elements_size;
  if (sVar1 != 0) {
    ppTVar2 = (this->elements).
              super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pTVar3 = *ppTVar2;
    if (sVar1 != 1) {
      *ppTVar2 = ppTVar2[sVar1 - 1];
      (this->elements).
      super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>._M_impl.
      super__Vector_impl_data._M_start[sVar1 - 1] = pTVar3;
      ppTVar2 = (this->elements).
                super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      (*ppTVar2)->mIndex = 1;
      ppTVar2[sVar1 - 1]->mIndex = sVar1;
    }
    this_00 = (pTVar3->selfPtr).super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (pTVar3->selfPtr).super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pTVar3->selfPtr).super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pTVar3->mMgr = (TimerMgr *)0x0;
    pTVar3->mIndex = 0;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    sVar1 = this->elements_size;
    (this->elements).super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>
    ._M_impl.super__Vector_impl_data._M_start[sVar1 - 1] = (Timer *)0x0;
    this->elements_size = sVar1 - 1;
    down(this,1);
    return;
  }
  return;
}

Assistant:

void pop() {
		if(this->elements_size > 0) {
			auto e = this->elements[0];
			this->swap(1,this->elements_size);
			e->mIndex = 0;
			e->mMgr  = nullptr;		
			e->selfPtr = nullptr;	
			this->elements[this->elements_size-1] = nullptr;
			--this->elements_size;
			this->down(1);
		}
	}